

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void print_title(FILE *out,int hdunum,int hdutype)

{
  int hdutype_local;
  int hdunum_local;
  FILE *out_local;
  
  curhdu = hdunum;
  curtype = hdutype;
  if (print_title::oldhdu != hdunum) {
    if (hdunum == 1) {
      sprintf(print_title::hdutitle," HDU %d: Primary Array ",1);
    }
    else if (hdutype == 0) {
      sprintf(print_title::hdutitle," HDU %d: Image Exten. ",(ulong)(uint)hdunum);
    }
    else if (hdutype == 1) {
      sprintf(print_title::hdutitle," HDU %d: ASCII Table ",(ulong)(uint)hdunum);
    }
    else if (hdutype == 2) {
      sprintf(print_title::hdutitle," HDU %d: BINARY Table ",(ulong)(uint)hdunum);
    }
    else {
      sprintf(print_title::hdutitle," HDU %d: Unknown Ext. ",(ulong)(uint)hdunum);
    }
    wrtsep(out,'=',print_title::hdutitle,0x3c);
    wrtout(out," ");
    print_title::oldhdu = curhdu;
    if (curhdu == totalhdu) {
      print_title::oldhdu = 0;
    }
  }
  return;
}

Assistant:

void print_title(FILE* out, int hdunum, int hdutype)
{
    static char hdutitle[64];
    static int oldhdu = 0;

    /* print out the title */
    curhdu = hdunum;
    curtype = hdutype;

    if(oldhdu == curhdu) return; /* Do not print it twice */
    if(curhdu == 1){
	        sprintf(hdutitle," HDU %d: Primary Array ", curhdu);
    }
    else { 
        switch (curtype) { 
	    case IMAGE_HDU:  
		sprintf(hdutitle," HDU %d: Image Exten. ", curhdu);
                break;
	    case ASCII_TBL:  
		sprintf(hdutitle," HDU %d: ASCII Table ", curhdu);
                break;
	    case BINARY_TBL:  
		sprintf(hdutitle," HDU %d: BINARY Table ", curhdu);
                break;
            default: 
		sprintf(hdutitle," HDU %d: Unknown Ext. ", curhdu);
                break;
        }
    } 
    wrtsep(out,'=',hdutitle,60);
    wrtout(out," ");
    oldhdu = curhdu;
    if(curhdu == totalhdu) oldhdu = 0;  /* reset the old hdu at the last hdu */
    return; 
}